

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SudokuGitter.cpp
# Opt level: O1

SudokuGitter * __thiscall
SudokuGitter::getSolvable(SudokuGitter *__return_storage_ptr__,SudokuGitter *this)

{
  pointer pvVar1;
  pointer pvVar2;
  long lVar3;
  pointer __first;
  size_t __i;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint col;
  ulong uVar8;
  double dVar9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> permutation;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2750;
  random_device local_2738;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b0;
  
  SudokuGitter(__return_storage_ptr__,this->elements);
  uVar6 = this->elements * this->elements;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_2750,(long)(int)uVar6,(allocator_type *)&local_13b0);
  if (0 < (int)uVar6) {
    dVar9 = ceil((double)(int)uVar6 * 0.3);
    uVar5 = 0;
    do {
      local_2750.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar5] = (uint)((double)(int)uVar5 < dVar9);
      uVar5 = uVar5 + 1;
    } while (uVar6 != uVar5);
  }
  __first = local_2750.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  std::random_device::random_device(&local_2738);
  uVar6 = std::random_device::_M_getval();
  local_13b0._M_x[0] = (unsigned_long)uVar6;
  lVar4 = 1;
  uVar5 = local_13b0._M_x[0];
  do {
    uVar5 = (ulong)(((uint)(uVar5 >> 0x1e) ^ (uint)uVar5) * 0x6c078965 + (int)lVar4);
    local_13b0._M_x[lVar4] = uVar5;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x270);
  local_13b0._M_p = 0x270;
  std::
  shuffle<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )__first,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )local_2750.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_13b0);
  std::random_device::_M_fini();
  uVar5 = (ulong)this->elements;
  if (uVar5 != 0) {
    lVar4 = 0;
    uVar7 = 0;
    do {
      pvVar1 = (__return_storage_ptr__->cells).
               super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar2 = (this->cells).
               super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = 0;
      do {
        if ((local_2750.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[(uint)((int)lVar4 + (int)uVar8)] == 1) &&
           (lVar3 = *(long *)&pvVar1[uVar7].super__Vector_base<cell,_std::allocator<cell>_>._M_impl,
           *(char *)(lVar3 + 4 + uVar8 * 8) == '\0')) {
          *(undefined4 *)(lVar3 + uVar8 * 8) =
               *(undefined4 *)
                (*(long *)&pvVar2[uVar7].super__Vector_base<cell,_std::allocator<cell>_>._M_impl +
                uVar8 * 8);
        }
        uVar8 = uVar8 + 1;
      } while (uVar5 != uVar8);
      uVar7 = uVar7 + 1;
      lVar4 = lVar4 + uVar5;
    } while (uVar7 != uVar5);
  }
  if (local_2750.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_2750.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

SudokuGitter SudokuGitter::getSolvable() {
    SudokuGitter solvable = SudokuGitter(getElements());

    int globalElements = getElements() * getElements();

    vector<unsigned int> permutation(globalElements);

    for (int i = 0; i < globalElements; i++) {
        if (i < ceil(globalElements * 0.30))
            permutation[i] = 1;
        else
            permutation[i] = 0;
    }

    shuffle(begin(permutation), end(permutation), std::mt19937(std::random_device()()));

    for (unsigned int row = 0; row < getElements(); row++) {
        for (unsigned int col = 0; col < getElements(); col++) {
            if (permutation[row * getElements() + col] == 1)
                solvable.setCell(row, col, getCellValue(row, col));
        }
    }

    return solvable;
}